

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

void __thiscall json11::Json::Json(Json *this,object *values)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001afd48;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR_type_001af8f8;
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(p_Var1 + 2),&(values->_M_t)._M_impl.super__Rb_tree_header);
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR_type_001af588;
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  return;
}

Assistant:

Json::Json(Json::object &&values)      : m_ptr(make_shared<JsonObject>(move(values))) {}